

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrumenter.cpp
# Opt level: O3

void __thiscall wasm::Instrumenter::addGlobals(Instrumenter *this,size_t numFuncs)

{
  pointer *ppNVar1;
  Module *pMVar2;
  pointer puVar3;
  Function *pFVar4;
  char *pcVar5;
  iterator __position;
  pointer pNVar6;
  long *plVar7;
  long *plVar8;
  pointer puVar9;
  Name *name;
  pointer pNVar10;
  undefined1 auVar11 [16];
  string_view sVar12;
  Name root;
  Name root_00;
  string_view local_a8;
  vector<wasm::Name,_std::allocator<wasm::Name>_> *local_98;
  long *local_90 [2];
  long local_80 [2];
  long *local_70;
  long local_68;
  long local_60;
  undefined4 uStack_58;
  undefined4 uStack_54;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  if (this->config->storageKind == InGlobals) {
    pMVar2 = this->wasm;
    auVar11 = wasm::IString::interned(0x11,"monotonic_counter",0);
    local_50._8_8_ = 0;
    local_38 = std::
               _Function_handler<bool_(wasm::Name),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/names.h:68:23)>
               ::_M_invoke;
    local_40 = std::
               _Function_handler<bool_(wasm::Name),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/names.h:68:23)>
               ::_M_manager;
    root.super_IString.str._M_str = (char *)&local_50;
    root.super_IString.str._M_len = auVar11._8_8_;
    local_50._M_unused._M_object = pMVar2;
    sVar12 = (string_view)
             Names::getValidName(auVar11._0_8_,root,(function<bool_(wasm::Name)> *)&local_50);
    if (local_40 != (code *)0x0) {
      (*local_40)(&local_50,&local_50,__destroy_functor);
    }
    (this->counterGlobal).super_IString.str = sVar12;
    local_98 = &this->functionGlobals;
    std::vector<wasm::Name,_std::allocator<wasm::Name>_>::reserve(local_98,numFuncs);
    puVar3 = (this->wasm->functions).
             super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    plVar7 = local_90[0];
    for (puVar9 = (this->wasm->functions).
                  super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; puVar9 != puVar3; puVar9 = puVar9 + 1)
    {
      local_90[0] = local_80;
      pFVar4 = (puVar9->_M_t).
               super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
               super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
      if (*(char **)((long)&(pFVar4->super_Importable).module + 8) == (char *)0x0) {
        pcVar5 = *(char **)((long)&(pFVar4->super_Importable).super_Named + 8);
        pMVar2 = this->wasm;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_90,pcVar5,
                   pcVar5 + *(long *)&(pFVar4->super_Importable).super_Named);
        plVar7 = (long *)std::__cxx11::string::append((char *)local_90);
        local_70 = &local_60;
        plVar8 = plVar7 + 2;
        if ((long *)*plVar7 == plVar8) {
          local_60 = *plVar8;
          uStack_58 = (undefined4)plVar7[3];
          uStack_54 = *(undefined4 *)((long)plVar7 + 0x1c);
        }
        else {
          local_60 = *plVar8;
          local_70 = (long *)*plVar7;
        }
        local_68 = plVar7[1];
        *plVar7 = (long)plVar8;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        auVar11 = wasm::IString::interned(local_68,local_70,0);
        local_50._8_8_ = 0;
        local_38 = std::
                   _Function_handler<bool_(wasm::Name),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/names.h:68:23)>
                   ::_M_invoke;
        local_40 = std::
                   _Function_handler<bool_(wasm::Name),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/names.h:68:23)>
                   ::_M_manager;
        root_00.super_IString.str._M_str = (char *)&local_50;
        root_00.super_IString.str._M_len = auVar11._8_8_;
        local_50._M_unused._M_object = pMVar2;
        sVar12 = (string_view)
                 Names::getValidName(auVar11._0_8_,root_00,
                                     (function<bool_(wasm::Name)> *)
                                     std::
                                     _Function_handler<bool_(wasm::Name),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/names.h:68:23)>
                                     ::_M_manager);
        if (local_40 != (code *)0x0) {
          (*local_40)(&local_50,&local_50,__destroy_functor);
        }
        __position._M_current =
             (this->functionGlobals).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        local_a8 = sVar12;
        if (__position._M_current ==
            (this->functionGlobals).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<wasm::Name,_std::allocator<wasm::Name>_>::_M_realloc_insert<wasm::Name>
                    (local_98,__position,(Name *)&local_a8);
        }
        else {
          local_a8._M_len = sVar12._M_len;
          local_a8._M_str = sVar12._M_str;
          ((__position._M_current)->super_IString).str._M_len = local_a8._M_len;
          ((__position._M_current)->super_IString).str._M_str = local_a8._M_str;
          ppNVar1 = &(this->functionGlobals).
                     super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                     super__Vector_impl_data._M_finish;
          *ppNVar1 = *ppNVar1 + 1;
        }
        if (local_70 != &local_60) {
          operator_delete(local_70,local_60 + 1);
        }
        plVar7 = local_90[0];
        if (local_90[0] != local_80) {
          operator_delete(local_90[0],local_80[0] + 1);
          plVar7 = local_90[0];
        }
      }
      local_90[0] = plVar7;
      plVar7 = local_90[0];
    }
    local_90[0] = plVar7;
    addGlobals::anon_class_8_1_8991fb9c::operator()
              ((anon_class_8_1_8991fb9c *)this,(Name)(this->counterGlobal).super_IString.str);
    pNVar6 = (this->functionGlobals).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    for (pNVar10 = (this->functionGlobals).
                   super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                   super__Vector_impl_data._M_start; pNVar10 != pNVar6; pNVar10 = pNVar10 + 1) {
      addGlobals::anon_class_8_1_8991fb9c::operator()
                ((anon_class_8_1_8991fb9c *)this,(Name)(pNVar10->super_IString).str);
    }
  }
  return;
}

Assistant:

void Instrumenter::addGlobals(size_t numFuncs) {
  if (config.storageKind != WasmSplitOptions::StorageKind::InGlobals) {
    // Don't need globals
    return;
  }
  // Create fresh global names (over-reserves, but that's ok)
  counterGlobal = Names::getValidGlobalName(*wasm, "monotonic_counter");
  functionGlobals.reserve(numFuncs);
  ModuleUtils::iterDefinedFunctions(*wasm, [&](Function* func) {
    functionGlobals.push_back(
      Names::getValidGlobalName(*wasm, func->name.toString() + "_timestamp"));
  });

  // Create and add new globals
  auto addGlobal = [&](Name name) {
    auto global = Builder::makeGlobal(
      name,
      Type::i32,
      Builder(*wasm).makeConst(Literal::makeZero(Type::i32)),
      Builder::Mutable);
    global->hasExplicitName = true;
    wasm->addGlobal(std::move(global));
  };
  addGlobal(counterGlobal);
  for (auto& name : functionGlobals) {
    addGlobal(name);
  }
}